

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.hpp
# Opt level: O2

void __thiscall duckdb::CSVColumnInfo::~CSVColumnInfo(CSVColumnInfo *this)

{
  LogicalType::~LogicalType(&this->type);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CSVColumnInfo(const string &name_p, const LogicalType &type_p) : name(name_p), type(type_p) {
	}